

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::local_m_map_t::resize
          (local_m_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  map_t *pmVar1;
  reference ppmVar2;
  uint local_24;
  value_type pmStack_20;
  loc_id_t id;
  clock_id_t local_18;
  loc_id_t local_14;
  clock_id_t clock_nb_local;
  loc_id_t loc_nb_local;
  local_m_map_t *this_local;
  
  local_18 = clock_nb;
  local_14 = loc_nb;
  _clock_nb_local = this;
  clear(this);
  this->_loc_nb = local_14;
  this->_clock_nb = local_18;
  pmStack_20 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::resize(&this->_M,(ulong)this->_loc_nb,&stack0xffffffffffffffe0);
  for (local_24 = 0; local_24 < this->_loc_nb; local_24 = local_24 + 1) {
    pmVar1 = allocate_map((ulong)this->_clock_nb);
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_M,(ulong)local_24);
    *ppmVar2 = pmVar1;
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_M,(ulong)local_24);
    clockbounds::clear(*ppmVar2);
  }
  return;
}

Assistant:

void local_m_map_t::resize(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
{
  clear();

  _loc_nb = loc_nb;
  _clock_nb = clock_nb;
  _M.resize(_loc_nb, nullptr);
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _M[id] = tchecker::clockbounds::allocate_map(_clock_nb);
    tchecker::clockbounds::clear(*_M[id]);
  }
}